

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evp.c
# Opt level: O1

void INT_EVhandle_control_message(CManager_conflict cm,CMConnection conn,uchar type,int arg)

{
  event_path_data evp;
  stone_type p_Var1;
  stone_type p_Var2;
  int stone_num;
  uint local_34;
  
  if (type < 2) {
    evp = cm->evp;
    if (0 < evp->stone_count) {
      stone_num = evp->stone_base_num;
      do {
        p_Var1 = stone_struct(evp,stone_num);
        p_Var2 = stone_struct(cm->evp,stone_num);
        if (((long)p_Var2->default_action != -1) &&
           (p_Var2->proto_actions[p_Var2->default_action].action_type == Action_Bridge)) {
          if (((CMConnection)p_Var1->proto_actions[p_Var1->default_action].o.term.handler == conn)
             && (p_Var1->proto_actions[p_Var1->default_action].o.bri.remote_stone_id == arg)) {
            local_34 = (uint)(type ^ 1);
            backpressure_transition(cm,stone_num,Stall_Squelch,local_34);
          }
        }
        stone_num = stone_num + 1;
      } while (stone_num < evp->stone_base_num + evp->stone_count);
    }
    return;
  }
  __assert_fail("FALSE",
                "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/evp.c"
                ,0xc43,
                "void INT_EVhandle_control_message(CManager, CMConnection, unsigned char, int)");
}

Assistant:

void
INT_EVhandle_control_message(CManager cm, CMConnection conn, unsigned char type, int arg) {
    event_path_data evp = cm->evp;
    switch (type) {
    case CONTROL_SQUELCH:
    case CONTROL_UNSQUELCH: {
            int s;
            stone_type stone;
            for (s = evp->stone_base_num; s < evp->stone_count + evp->stone_base_num; ++s) {
                stone = stone_struct(evp, s);
                if (is_bridge_stone(cm, s) &&  stone->proto_actions[stone->default_action].o.bri.conn == conn
                        && stone->proto_actions[stone->default_action].o.bri.remote_stone_id == arg) {
                    backpressure_transition(cm, s, Stall_Squelch, type == CONTROL_SQUELCH);
                }
            }
        }
        break;
    default:
        assert(FALSE);
    }
}